

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

Optional<unsigned_int> __thiscall
Corrade::Utility::Json::parseUnsignedInt(Json *this,JsonToken *token)

{
  JsonToken *pJVar1;
  bool bVar2;
  State *pSVar3;
  Debug *pDVar4;
  ostream *output;
  JsonToken *in_RDX;
  BasicStringView<const_char> string;
  Error err;
  
  pSVar3 = Containers::Pointer<Corrade::Utility::Json::State>::operator->
                     ((Pointer<Corrade::Utility::Json::State> *)token);
  pJVar1 = (pSVar3->tokens)._data;
  pSVar3 = Containers::Pointer<Corrade::Utility::Json::State>::operator->
                     ((Pointer<Corrade::Utility::Json::State> *)token);
  if ((ulong)(((long)in_RDX - (long)pJVar1) / 0x18) < (pSVar3->tokens)._size) {
    if ((uint)(in_RDX->_sizeFlagsParsedTypeType >> 0x3d) == 5) {
      bVar2 = parseUnsignedIntInternal((Json *)token,"Utility::Json::parseUnsignedInt():",in_RDX);
      if (bVar2) {
        *(undefined1 *)((long)&(this->_state)._pointer + 4) = 1;
        *(float *)&(this->_state)._pointer = (in_RDX->field_2)._parsedFloat;
      }
      else {
        *(undefined1 *)((long)&(this->_state)._pointer + 4) = 0;
      }
    }
    else {
      Error::Error(&err,(Flags)0x0);
      pDVar4 = Debug::operator<<(&err.super_Debug,
                                 "Utility::Json::parseUnsignedInt(): expected a number, got");
      pDVar4 = Utility::operator<<(pDVar4,in_RDX->_sizeFlagsParsedTypeType & (String|Object));
      Debug::operator<<(pDVar4,"at");
      pSVar3 = Containers::Pointer<Corrade::Utility::Json::State>::operator->
                         ((Pointer<Corrade::Utility::Json::State> *)token);
      string = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                         (&pSVar3->string,in_RDX->_data);
      printFilePosition((Json *)token,&err.super_Debug,string);
      *(undefined1 *)((long)&(this->_state)._pointer + 4) = 0;
      Error::~Error(&err);
    }
    return (Optional<unsigned_int>)this;
  }
  output = Error::defaultOutput();
  Error::Error(&err,output,(Flags)0x0);
  Debug::operator<<(&err.super_Debug,
                    "Utility::Json::parseUnsignedInt(): token not owned by the instance");
  Error::~Error(&err);
  abort();
}

Assistant:

Containers::Optional<std::uint32_t> Json::parseUnsignedInt(const JsonToken& token) {
    CORRADE_ASSERT(std::size_t(&token - _state->tokens) < _state->tokens.size(),
        "Utility::Json::parseUnsignedInt(): token not owned by the instance", {});

    if(token.type() != JsonToken::Type::Number) {
        Error err;
        err << "Utility::Json::parseUnsignedInt(): expected a number, got" << token.type() << "at";
        printFilePosition(err, _state->string.prefix(token._data));
        return {};
    }
    if(!parseUnsignedIntInternal("Utility::Json::parseUnsignedInt():", const_cast<JsonToken&>(token)))
        return {};
    return token._parsedUnsignedInt;
}